

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O1

void __thiscall HACD::SArray<long,_16UL>::PushBack(SArray<long,_16UL> *this,long *value)

{
  size_t sVar1;
  long lVar2;
  long *__dest;
  SArray<long,_16UL> *pSVar3;
  SArray<long,_16UL> *__src;
  
  sVar1 = this->m_maxSize;
  if (this->m_size == sVar1) {
    __dest = (long *)operator_new__(-(ulong)(sVar1 * 2 >> 0x3d != 0) | sVar1 << 4);
    pSVar3 = (SArray<long,_16UL> *)this->m_data;
    __src = pSVar3;
    if (sVar1 == 0x10) {
      __src = this;
    }
    memcpy(__dest,__src,sVar1 << 3);
    if (pSVar3 != (SArray<long,_16UL> *)0x0) {
      operator_delete__(pSVar3);
    }
    this->m_data = __dest;
    this->m_maxSize = sVar1 * 2;
  }
  sVar1 = this->m_size;
  pSVar3 = this;
  if (this->m_maxSize != 0x10) {
    pSVar3 = (SArray<long,_16UL> *)this->m_data;
  }
  lVar2 = *value;
  this->m_size = sVar1 + 1;
  pSVar3->m_data0[sVar1] = lVar2;
  return;
}

Assistant:

void                    PushBack(const T &  value)
                                    {
                                        if (m_size==m_maxSize)
                                        {
                                            size_t maxSize = (m_maxSize << 1);                                            
                                            T * temp = new T[maxSize];
                                            memcpy(temp, Data(), m_maxSize*sizeof(T));
                                            delete [] m_data;
                                            m_data = temp;
                                            m_maxSize = maxSize;
                                        }
                                        T * const data = Data();
                                        data[m_size++] = value;
                                    }